

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,LightEdge *e)

{
  ostream *poVar1;
  LightEdge *e_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,e->u);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,e->v);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph::LightEdge &e) {
    stream << "(" << e.u << ", " << e.v << ")";
    return stream;
}